

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

pool_ptr<soul::AST::Block> __thiscall
soul::RewritingASTVisitor::visitAs<soul::AST::Block>
          (RewritingASTVisitor *this,pool_ptr<soul::AST::Block> *o)

{
  Block *t;
  Statement *pSVar1;
  pool_ptr<soul::AST::Block> *in_RDX;
  
  if (in_RDX->object == (Block *)0x0) {
    pSVar1 = (Statement *)0x0;
  }
  else {
    t = pool_ptr<soul::AST::Block>::operator*(in_RDX);
    pSVar1 = visitObject((RewritingASTVisitor *)o,&t->super_Statement);
  }
  this->_vptr_RewritingASTVisitor = (_func_int **)pSVar1;
  return (pool_ptr<soul::AST::Block>)(Block *)this;
}

Assistant:

pool_ptr<Type> visitAs (pool_ptr<Type> o)
    {
        if (o == nullptr)
            return {};

        SOUL_ASSERT (is_type<Type> (o));
        return static_cast<Type&> (visitObject (*o));
    }